

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

void __thiscall
AbstractContentContext::AbstractContentContext
          (AbstractContentContext *this,DocumentContext *inDocumentContext)

{
  DocumentContext *inDocumentContext_local;
  AbstractContentContext *this_local;
  
  this->_vptr_AbstractContentContext = (_func_int **)&PTR__AbstractContentContext_0054cf48;
  PrimitiveObjectsWriter::PrimitiveObjectsWriter(&this->mPrimitiveWriter,(IByteWriter *)0x0);
  GraphicStateStack::GraphicStateStack(&this->mGraphicStack);
  std::
  set<IContentContextListener_*,_std::less<IContentContextListener_*>,_std::allocator<IContentContextListener_*>_>
  ::set(&this->mListeners);
  this->mDocumentContext = inDocumentContext;
  this->mCurrentStatusCode = eSuccess;
  return;
}

Assistant:

AbstractContentContext::AbstractContentContext(PDFHummus::DocumentContext* inDocumentContext)
{
	mDocumentContext = inDocumentContext;
	mCurrentStatusCode = eSuccess;
}